

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char *in_RSI;
  ErrMsg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  char *local_18;
  char *local_8;
  
  local_18 = in_RSI + 1;
  if (*in_RSI == '%') {
    if (*local_18 == '\0') {
      lj_err_caller((lua_State *)CONCAT44(0x25,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
      ;
    }
    local_8 = in_RSI + 2;
  }
  else {
    local_8 = local_18;
    if (*in_RSI == '[') {
      if (*local_18 == '^') {
        local_18 = in_RSI + 2;
      }
      do {
        if (*local_18 == '\0') {
          lj_err_caller((lua_State *)CONCAT44(0x5b,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
        }
        pcVar1 = local_18 + 1;
        if ((*local_18 == '%') && (*pcVar1 != '\0')) {
          pcVar1 = local_18 + 2;
        }
        local_18 = pcVar1;
      } while (*local_18 != ']');
      local_8 = local_18 + 1;
    }
  }
  return local_8;
}

Assistant:

static const char *classend(MatchState *ms, const char *p)
{
  switch (*p++) {
  case L_ESC:
    if (*p == '\0')
      lj_err_caller(ms->L, LJ_ERR_STRPATE);
    return p+1;
  case '[':
    if (*p == '^') p++;
    do {  /* look for a `]' */
      if (*p == '\0')
	lj_err_caller(ms->L, LJ_ERR_STRPATM);
      if (*(p++) == L_ESC && *p != '\0')
	p++;  /* skip escapes (e.g. `%]') */
    } while (*p != ']');
    return p+1;
  default:
    return p;
  }
}